

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# movDemuxer.cpp
# Opt level: O2

void __thiscall
MovDemuxer::getTrackList
          (MovDemuxer *this,
          map<int,_TrackInfo,_std::less<int>,_std::allocator<std::pair<const_int,_TrackInfo>_>_>
          *trackList)

{
  IOContextTrackType IVar1;
  Track *pTVar2;
  int trackType;
  long lVar3;
  undefined1 local_98 [56];
  undefined1 local_60 [48];
  
  lVar3 = 0;
  while (lVar3 < (this->super_IOContextDemuxer).num_tracks) {
    pTVar2 = (this->super_IOContextDemuxer).tracks[lVar3];
    IVar1 = pTVar2->type;
    if (IVar1 == CONTROL) {
      lVar3 = lVar3 + 1;
    }
    else {
      trackType = 400;
      if (IVar1 != SUBTITLE) {
        trackType = 0;
      }
      lVar3 = lVar3 + 1;
      TrackInfo::TrackInfo((TrackInfo *)local_60,trackType,pTVar2->language,0);
      local_98._0_4_ = (undefined4)lVar3;
      TrackInfo::TrackInfo((TrackInfo *)(local_98 + 8),(TrackInfo *)local_60);
      std::
      _Rb_tree<int,std::pair<int_const,TrackInfo>,std::_Select1st<std::pair<int_const,TrackInfo>>,std::less<int>,std::allocator<std::pair<int_const,TrackInfo>>>
      ::_M_emplace_unique<std::pair<int,TrackInfo>>
                ((_Rb_tree<int,std::pair<int_const,TrackInfo>,std::_Select1st<std::pair<int_const,TrackInfo>>,std::less<int>,std::allocator<std::pair<int_const,TrackInfo>>>
                  *)trackList,(pair<int,_TrackInfo> *)local_98);
      std::__cxx11::string::~string((string *)(local_98 + 0x10));
      std::__cxx11::string::~string((string *)(local_60 + 8));
    }
  }
  return;
}

Assistant:

void MovDemuxer::getTrackList(std::map<int32_t, TrackInfo>& trackList)
{
    for (int i = 0; i < num_tracks; i++)
    {
        if (tracks[i]->type != IOContextTrackType::CONTROL)
            trackList.insert(
                std::make_pair(i + 1, TrackInfo(tracks[i]->type == IOContextTrackType::SUBTITLE ? TRACKTYPE_SRT : 0,
                                                tracks[i]->language, 0)));
    }
}